

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O0

bool __thiscall
icu_63::numparse::impl::StringSegment::startsWith(StringSegment *this,UnicodeSet *uniset)

{
  UBool UVar1;
  UChar32 c;
  UChar32 cp;
  UnicodeSet *uniset_local;
  StringSegment *this_local;
  
  c = getCodePoint(this);
  if (c == -1) {
    this_local._7_1_ = false;
  }
  else {
    UVar1 = UnicodeSet::contains(uniset,c);
    this_local._7_1_ = UVar1 != '\0';
  }
  return this_local._7_1_;
}

Assistant:

bool StringSegment::startsWith(const UnicodeSet& uniset) const {
    // TODO: Move UnicodeSet case-folding logic here.
    // TODO: Handle string matches here instead of separately.
    UChar32 cp = getCodePoint();
    if (cp == -1) {
        return false;
    }
    return uniset.contains(cp);
}